

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O2

QOffscreenBackingStore * __thiscall
QOffscreenBackingStore::grabWindow(QOffscreenBackingStore *this,WId window,QRect *rect)

{
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  QRect local_68;
  QPoint local_50;
  QRect local_48;
  QRect local_38;
  QRect *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  local_28 = rect;
  local_38 = QHash<unsigned_long_long,_QRect>::value
                       ((QHash<unsigned_long_long,_QRect> *)(window + 0x28),
                        (unsigned_long_long *)&local_28,&local_68);
  if (local_38.y1.m_i.m_i + -1 != local_38.y2.m_i.m_i ||
      local_38.x1.m_i.m_i + -1 != local_38.x2.m_i.m_i) {
    local_48._0_8_ = *in_RCX;
    local_48._8_8_ = in_RCX[1];
    if ((local_48.x2.m_i - local_48.x1.m_i) + 1 < 1) {
      local_48.x2.m_i = (local_38.x2.m_i.m_i - local_38.x1.m_i) + local_48.x1.m_i;
    }
    if ((local_48.y2.m_i - local_48.y1.m_i) + 1 < 1) {
      local_48.y2.m_i = (local_38.y2.m_i.m_i - local_38.y1.m_i) + local_48.y1.m_i;
    }
    local_50 = local_38._0_8_;
    local_68 = QRect::translated(&local_48,&local_50);
    local_48 = (QRect)QRect::operator&(&local_68,&local_38);
    if ((local_48.x1.m_i.m_i <= local_48.x2.m_i.m_i) && (local_48.y1.m_i.m_i <= local_48.y2.m_i.m_i)
       ) {
      QImage::copy(&local_68);
      QPixmap::fromImageInPlace(this,&local_68,0);
      QImage::~QImage((QImage *)&local_68);
      goto LAB_0010c17d;
    }
  }
  QPixmap::QPixmap((QPixmap *)this);
LAB_0010c17d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QOffscreenBackingStore::grabWindow(WId window, const QRect &rect) const
{
    QRect area = m_windowAreaHash.value(window, QRect());
    if (area.isNull())
        return QPixmap();

    QRect adjusted = rect;
    if (adjusted.width() <= 0)
        adjusted.setWidth(area.width());
    if (adjusted.height() <= 0)
        adjusted.setHeight(area.height());

    adjusted = adjusted.translated(area.topLeft()) & area;

    if (adjusted.isEmpty())
        return QPixmap();

    return QPixmap::fromImage(m_image.copy(adjusted));
}